

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O0

dict_itor * wb_dict_itor_new(wb_tree *tree)

{
  wb_node *pwVar1;
  dict_itor *itor;
  wb_tree *tree_local;
  
  tree_local = (wb_tree *)(*dict_malloc_func)(0x10);
  if (tree_local != (wb_tree *)0x0) {
    pwVar1 = (wb_node *)wb_itor_new(tree);
    tree_local->root = pwVar1;
    if (pwVar1 == (wb_node *)0x0) {
      (*dict_free_func)(tree_local);
      tree_local = (wb_tree *)0x0;
    }
    else {
      tree_local->count = (size_t)&wb_tree_itor_vtable;
    }
  }
  return (dict_itor *)tree_local;
}

Assistant:

dict_itor*
wb_dict_itor_new(wb_tree* tree)
{
    dict_itor* itor = MALLOC(sizeof(*itor));
    if (itor) {
	if (!(itor->_itor = wb_itor_new(tree))) {
	    FREE(itor);
	    return NULL;
	}
	itor->_vtable = &wb_tree_itor_vtable;
    }
    return itor;
}